

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O3

int SHMLock(void)

{
  CCLock::Enter(&shm_critsec);
  lock_count.m_val = lock_count.m_val + 1;
  if (PAL_InitializeChakraCoreCalled != false) {
    return lock_count.m_val;
  }
  abort();
}

Assistant:

int SHMLock(void)
{
    shm_critsec.Enter();

    lock_count++;
    TRACE("SHM lock level is now %d\n", lock_count.Load());
    return lock_count;
}